

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node_handle.cpp
# Opt level: O2

Publisher __thiscall miniros::NodeHandle::advertise(NodeHandle *this,AdvertiseOptions *ops)

{
  vector<std::weak_ptr<miniros::Publisher::Impl>,std::allocator<std::weak_ptr<miniros::Publisher::Impl>>>
  *this_00;
  bool bVar1;
  CallbackQueue *pCVar2;
  AdvertiseOptions *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  pthread_mutex_t *__mutex;
  Publisher PVar3;
  undefined1 local_58 [16];
  SubscriberCallbacksPtr callbacks;
  
  resolveName((string *)&callbacks,(NodeHandle *)ops,&in_RDX->topic,true);
  std::__cxx11::string::operator=((string *)in_RDX,(string *)&callbacks);
  std::__cxx11::string::~string((string *)&callbacks);
  if (in_RDX->callback_queue == (CallbackQueueInterface *)0x0) {
    pCVar2 = (CallbackQueue *)(ops->connect_cb)._M_invoker;
    if (pCVar2 == (CallbackQueue *)0x0) {
      pCVar2 = getGlobalCallbackQueue();
    }
    in_RDX->callback_queue = &pCVar2->super_CallbackQueueInterface;
  }
  std::
  make_shared<miniros::SubscriberCallbacks,std::function<void(miniros::SingleSubscriberPublisher_const&)>&,std::function<void(miniros::SingleSubscriberPublisher_const&)>&,std::shared_ptr<void_const>&,miniros::CallbackQueueInterface*&>
            ((function<void_(const_miniros::SingleSubscriberPublisher_&)> *)&callbacks,
             &in_RDX->connect_cb,(shared_ptr<const_void> *)&in_RDX->disconnect_cb,
             (CallbackQueueInterface **)&in_RDX->tracked_object);
  getTopicManager((NodeHandle *)local_58);
  bVar1 = TopicManager::advertise((TopicManager *)local_58._0_8_,in_RDX,&callbacks);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_58 + 8));
  if (bVar1) {
    Publisher::Publisher
              ((Publisher *)this,&in_RDX->topic,&in_RDX->md5sum,&in_RDX->datatype,(NodeHandle *)ops,
               &callbacks);
    __mutex = (pthread_mutex_t *)
              (*(long *)&(ops->disconnect_cb).super__Function_base._M_functor + 0x60);
    std::mutex::lock((mutex *)&__mutex->__data);
    this_00 = *(vector<std::weak_ptr<miniros::Publisher::Impl>,std::allocator<std::weak_ptr<miniros::Publisher::Impl>>>
                **)&(ops->disconnect_cb).super__Function_base._M_functor;
    std::__weak_ptr<miniros::Publisher::Impl,(__gnu_cxx::_Lock_policy)2>::
    __weak_ptr<miniros::Publisher::Impl,void>
              ((__weak_ptr<miniros::Publisher::Impl,(__gnu_cxx::_Lock_policy)2> *)local_58,
               (__shared_ptr<miniros::Publisher::Impl,_(__gnu_cxx::_Lock_policy)2> *)this);
    std::
    vector<std::weak_ptr<miniros::Publisher::Impl>,std::allocator<std::weak_ptr<miniros::Publisher::Impl>>>
    ::emplace_back<std::weak_ptr<miniros::Publisher::Impl>>
              (this_00,(weak_ptr<miniros::Publisher::Impl> *)local_58);
    std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count
              ((__weak_count<(__gnu_cxx::_Lock_policy)2> *)(local_58 + 8));
    pthread_mutex_unlock(__mutex);
  }
  else {
    (this->namespace_)._M_dataplus._M_p = (pointer)0x0;
    (this->namespace_)._M_string_length = 0;
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&callbacks.super___shared_ptr<miniros::SubscriberCallbacks,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  PVar3.impl_.super___shared_ptr<miniros::Publisher::Impl,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = extraout_RDX._M_pi;
  PVar3.impl_.super___shared_ptr<miniros::Publisher::Impl,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (Publisher)
         PVar3.impl_.super___shared_ptr<miniros::Publisher::Impl,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Publisher NodeHandle::advertise(AdvertiseOptions& ops)
{
  ops.topic = resolveName(ops.topic);
  if (ops.callback_queue == 0)
  {
    if (callback_queue_)
    {
      ops.callback_queue = callback_queue_;
    }
    else
    {
      ops.callback_queue = getGlobalCallbackQueue();
    }
  }

  SubscriberCallbacksPtr callbacks(std::make_shared<SubscriberCallbacks>(ops.connect_cb, ops.disconnect_cb, 
                                                                           ops.tracked_object, ops.callback_queue));

  if (getTopicManager()->advertise(ops, callbacks))
  {
    Publisher pub(ops.topic, ops.md5sum, ops.datatype, *this, callbacks);

    {
      std::scoped_lock<std::mutex> lock(collection_->mutex_);
      collection_->pubs_.push_back(pub.impl_);
    }

    return pub;
  }

  return Publisher();
}